

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProjectOrder::IfcProjectOrder(IfcProjectOrder *this)

{
  IfcProjectOrder *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x158,"IfcProjectOrder");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00f11a50);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>,
             &PTR_construction_vtable_24__00f11b00);
  *(undefined8 *)this = 0xf11970;
  *(undefined8 *)&this->field_0x158 = 0xf11a38;
  *(undefined8 *)&this->field_0x88 = 0xf11998;
  *(undefined8 *)&this->field_0x98 = 0xf119c0;
  *(undefined8 *)&this->field_0xd0 = 0xf119e8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>)._vptr_ObjectHelper =
       (_func_int **)0xf11a10;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrder,_3UL>).field_0x10);
  std::__cxx11::string::string((string *)&this->PredefinedType);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Status);
  return;
}

Assistant:

IfcProjectOrder() : Object("IfcProjectOrder") {}